

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_quad_value_bit_vector.h
# Opt level: O0

string * __thiscall
bsim::static_quad_value_bit_vector<41>::binary_string_abi_cxx11_
          (static_quad_value_bit_vector<41> *this)

{
  static_quad_value_bit_vector<41> *in_RSI;
  string *in_RDI;
  int i;
  string *str;
  string local_48 [32];
  int ind;
  undefined4 in_stack_ffffffffffffffdc;
  allocator local_12;
  undefined1 local_11;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,"",&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  for (ind = 0x28; -1 < ind; ind = ind + -1) {
    get(in_RSI,ind);
    quad_value::binary_string_abi_cxx11_((quad_value *)CONCAT44(in_stack_ffffffffffffffdc,ind));
    std::__cxx11::string::operator+=(in_RDI,local_48);
    std::__cxx11::string::~string(local_48);
  }
  return in_RDI;
}

Assistant:

std::string binary_string() const {
      std::string str = "";
      for (int i = N - 1; i >= 0; i--) {
        str += get(i).binary_string();
      }

      return str;
    }